

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::
RegisterMulticastListener(std::function<void(unsigned_char_const*,ot::commissioner::Error)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_int)
::$_0::__0(__0 *this,anon_class_72_4_c16cb468 *param_1)

{
  anon_class_72_4_c16cb468 *param_1_local;
  anon_class_72_4_c16cb468 *this_local;
  
  *(CommissionerSafe **)this = param_1->this;
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::function
            ((function<void_(const_unsigned_char_*,_ot::commissioner::Error)> *)(this + 8),
             &param_1->aHandler);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(this + 0x28),&param_1->aMulticastAddrList);
  *(uint32_t *)(this + 0x40) = param_1->aTimeout;
  return;
}

Assistant:

Error CommissionerSafe::RegisterMulticastListener(uint8_t                        &aStatus,
                                                  const std::vector<std::string> &aMulticastAddrList,
                                                  uint32_t                        aTimeout)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aStatus](const uint8_t *status, Error error) {
        if (status != nullptr)
        {
            aStatus = *status;
        }
        pro.set_value(error);
    };

    RegisterMulticastListener(wait, aMulticastAddrList, aTimeout);
    return pro.get_future().get();
}